

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularStringView::
GenerateConstexprAggregateInitializer(SingularStringView *this,Printer *p)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if ((this->super_FieldGeneratorBase).is_inlined_ == true) {
    pcVar2 = "\n      /*decltype($field_$)*/ {nullptr, false},\n    ";
    uVar1 = 0x34;
  }
  else if (this->opts_->experimental_use_micro_string == true) {
    pcVar2 = "\n      /*decltype($field_$)*/ {},\n    ";
    uVar1 = 0x26;
  }
  else {
    pcVar2 = 
    "\n      /*decltype($field_$)*/ {\n          &::_pbi::fixed_address_empty_string,\n          ::_pbi::ConstantInitialized{},\n      },\n    "
    ;
    uVar1 = 0x85;
  }
  io::Printer::Emit(p,0,0,uVar1,pcVar2);
  return;
}

Assistant:

void SingularStringView::GenerateConstexprAggregateInitializer(
    io::Printer* p) const {
  if (is_inlined()) {
    p->Emit(R"cc(
      /*decltype($field_$)*/ {nullptr, false},
    )cc");
  } else if (use_micro_string()) {
    p->Emit(R"cc(
      /*decltype($field_$)*/ {},
    )cc");
  } else {
    p->Emit(R"cc(
      /*decltype($field_$)*/ {
          &::_pbi::fixed_address_empty_string,
          ::_pbi::ConstantInitialized{},
      },
    )cc");
  }
}